

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O2

void __thiscall
cbtSimulationIslandManager::buildIslands
          (cbtSimulationIslandManager *this,cbtDispatcher *dispatcher,
          cbtCollisionWorld *collisionWorld)

{
  int iVar1;
  cbtElement *pcVar2;
  cbtCollisionObject *pcVar3;
  cbtCollisionObject *this_00;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  int iVar6;
  long lVar7;
  int idx;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  CProfileSample __profile;
  cbtPersistentManifold *manifold;
  cbtAlignedObjectArray<cbtPersistentManifold_*> *local_38;
  
  CProfileSample::CProfileSample((CProfileSample *)&__profile,"islandUnionFindAndQuickSort");
  local_38 = &this->m_islandmanifold;
  manifold = (cbtPersistentManifold *)0x0;
  cbtAlignedObjectArray<cbtPersistentManifold_*>::resize(local_38,0,&manifold);
  cbtUnionFind::sortIslands(&this->m_unionFind);
  iVar5 = (this->m_unionFind).m_elements.m_size;
  iVar11 = 0;
LAB_00dea2ba:
  do {
    if (iVar5 <= iVar11) {
      uVar4 = (*dispatcher->_vptr_cbtDispatcher[9])();
      for (uVar8 = 0; (~((int)uVar4 >> 0x1f) & uVar4) != uVar8; uVar8 = uVar8 + 1) {
        iVar5 = (*dispatcher->_vptr_cbtDispatcher[10])();
        manifold = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar5);
        if (((collisionWorld->m_dispatchInfo).m_deterministicOverlappingPairs != true) ||
           (manifold->m_cachedPoints != 0)) {
          pcVar3 = manifold->m_body0;
          this_00 = manifold->m_body1;
          if (((pcVar3 != (cbtCollisionObject *)0x0) && (pcVar3->m_activationState1 != 2)) ||
             ((this_00 != (cbtCollisionObject *)0x0 && (this_00->m_activationState1 != 2)))) {
            if (((pcVar3->m_collisionFlags & 2U) != 0) &&
               (((pcVar3->m_collisionFlags & 4U) == 0 && (pcVar3->m_activationState1 != 2)))) {
              cbtCollisionObject::activate(this_00,false);
            }
            if ((((this_00->m_collisionFlags & 2U) != 0) && ((this_00->m_collisionFlags & 4U) == 0))
               && (this_00->m_activationState1 != 2)) {
              cbtCollisionObject::activate(pcVar3,false);
            }
            if ((this->m_splitIslands == true) &&
               (iVar5 = (*dispatcher->_vptr_cbtDispatcher[7])(dispatcher,pcVar3,this_00),
               (char)iVar5 != '\0')) {
              cbtAlignedObjectArray<cbtPersistentManifold_*>::push_back(local_38,&manifold);
            }
          }
        }
      }
      CProfileSample::~CProfileSample((CProfileSample *)&__profile);
      return;
    }
    pcVar2 = (this->m_unionFind).m_elements.m_data;
    lVar9 = (long)iVar11;
    iVar1 = pcVar2[lVar9].m_id;
    lVar7 = lVar9;
    do {
      iVar10 = iVar11;
      lVar7 = lVar7 + 1;
      iVar11 = iVar5;
      iVar6 = iVar5 + -1;
      if (iVar5 <= lVar7) break;
      iVar11 = iVar10 + 1;
      iVar6 = iVar10;
    } while (pcVar2[lVar7].m_id == iVar1);
    lVar12 = (long)iVar6;
    for (lVar7 = lVar9; lVar7 <= lVar12; lVar7 = lVar7 + 1) {
      pcVar3 = (collisionWorld->m_collisionObjects).m_data[pcVar2[lVar7].m_sz];
      if ((pcVar3->m_islandTag1 == iVar1) &&
         ((iVar6 = pcVar3->m_activationState1, iVar6 == 4 || (iVar6 == 1)))) goto LAB_00dea3a1;
    }
    for (; lVar9 <= lVar12; lVar9 = lVar9 + 1) {
      pcVar3 = (collisionWorld->m_collisionObjects).m_data
               [(this->m_unionFind).m_elements.m_data[lVar9].m_sz];
      if (pcVar3->m_islandTag1 == iVar1) {
        cbtCollisionObject::setActivationState(pcVar3,2);
      }
    }
  } while( true );
LAB_00dea3a1:
  for (; lVar9 <= lVar12; lVar9 = lVar9 + 1) {
    pcVar3 = (collisionWorld->m_collisionObjects).m_data
             [(this->m_unionFind).m_elements.m_data[lVar9].m_sz];
    if ((pcVar3->m_islandTag1 == iVar1) && (pcVar3->m_activationState1 == 2)) {
      cbtCollisionObject::setActivationState(pcVar3,3);
      pcVar3->m_deactivationTime = 0.0;
    }
  }
  goto LAB_00dea2ba;
}

Assistant:

void cbtSimulationIslandManager::buildIslands(cbtDispatcher* dispatcher, cbtCollisionWorld* collisionWorld)
{
	BT_PROFILE("islandUnionFindAndQuickSort");

	cbtCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	m_islandmanifold.resize(0);

	//we are going to sort the unionfind array, and store the element id in the size
	//afterwards, we clean unionfind, to make sure no-one uses it anymore

	getUnionFind().sortIslands();
	int numElem = getUnionFind().getNumElements();

	int endIslandIndex = 1;
	int startIslandIndex;

	//update the sleeping state for bodies, if all are sleeping
	for (startIslandIndex = 0; startIslandIndex < numElem; startIslandIndex = endIslandIndex)
	{
		int islandId = getUnionFind().getElement(startIslandIndex).m_id;
		for (endIslandIndex = startIslandIndex + 1; (endIslandIndex < numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId); endIslandIndex++)
		{
		}

		//int numSleeping = 0;

		bool allSleeping = true;

		int idx;
		for (idx = startIslandIndex; idx < endIslandIndex; idx++)
		{
			int i = getUnionFind().getElement(idx).m_sz;

			cbtCollisionObject* colObj0 = collisionObjects[i];
			if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
			{
				//				printf("error in island management\n");
			}

			cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));
			if (colObj0->getIslandTag() == islandId)
			{
				if (colObj0->getActivationState() == ACTIVE_TAG ||
					colObj0->getActivationState() == DISABLE_DEACTIVATION)
				{
					allSleeping = false;
					break;
				}
			}
		}

		if (allSleeping)
		{
			int idx;
			for (idx = startIslandIndex; idx < endIslandIndex; idx++)
			{
				int i = getUnionFind().getElement(idx).m_sz;
				cbtCollisionObject* colObj0 = collisionObjects[i];
				if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
				{
					//					printf("error in island management\n");
				}

				cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));

				if (colObj0->getIslandTag() == islandId)
				{
					colObj0->setActivationState(ISLAND_SLEEPING);
				}
			}
		}
		else
		{
			int idx;
			for (idx = startIslandIndex; idx < endIslandIndex; idx++)
			{
				int i = getUnionFind().getElement(idx).m_sz;

				cbtCollisionObject* colObj0 = collisionObjects[i];
				if ((colObj0->getIslandTag() != islandId) && (colObj0->getIslandTag() != -1))
				{
					//					printf("error in island management\n");
				}

				cbtAssert((colObj0->getIslandTag() == islandId) || (colObj0->getIslandTag() == -1));

				if (colObj0->getIslandTag() == islandId)
				{
					if (colObj0->getActivationState() == ISLAND_SLEEPING)
					{
						colObj0->setActivationState(WANTS_DEACTIVATION);
						colObj0->setDeactivationTime(0.f);
					}
				}
			}
		}
	}

	int i;
	int maxNumManifolds = dispatcher->getNumManifolds();

	//#define SPLIT_ISLANDS 1
	//#ifdef SPLIT_ISLANDS

	//#endif //SPLIT_ISLANDS

	for (i = 0; i < maxNumManifolds; i++)
	{
		cbtPersistentManifold* manifold = dispatcher->getManifoldByIndexInternal(i);
		if (collisionWorld->getDispatchInfo().m_deterministicOverlappingPairs)
		{
			if (manifold->getNumContacts() == 0)
				continue;
		}

		const cbtCollisionObject* colObj0 = static_cast<const cbtCollisionObject*>(manifold->getBody0());
		const cbtCollisionObject* colObj1 = static_cast<const cbtCollisionObject*>(manifold->getBody1());

		///@todo: check sleeping conditions!
		if (((colObj0) && colObj0->getActivationState() != ISLAND_SLEEPING) ||
			((colObj1) && colObj1->getActivationState() != ISLAND_SLEEPING))
		{
			//kinematic objects don't merge islands, but wake up all connected objects
			if (colObj0->isKinematicObject() && colObj0->getActivationState() != ISLAND_SLEEPING)
			{
				if (colObj0->hasContactResponse())
					colObj1->activate();
			}
			if (colObj1->isKinematicObject() && colObj1->getActivationState() != ISLAND_SLEEPING)
			{
				if (colObj1->hasContactResponse())
					colObj0->activate();
			}
			if (m_splitIslands)
			{
				//filtering for response
				if (dispatcher->needsResponse(colObj0, colObj1))
					m_islandmanifold.push_back(manifold);
			}
		}
	}
}